

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceMemoryBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceMemoryBase<Diligent::EngineVkImplTraits>::DvpVerifyResize
          (DeviceMemoryBase<Diligent::EngineVkImplTraits> *this,Uint64 NewSize)

{
  string msg;
  char (*in_stack_ffffffffffffffc8) [2];
  Uint64 local_30;
  string local_28;
  
  if (NewSize % (this->
                super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                ).m_Desc.PageSize != 0) {
    local_30 = NewSize;
    FormatString<char[10],unsigned_long,char[41],unsigned_long,char[2]>
              (&local_28,(Diligent *)"NewSize (",(char (*) [10])&local_30,
               (unsigned_long *)") must be  a multiple of the page size (",
               (char (*) [41])
               &(this->
                super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                ).m_Desc.PageSize,(unsigned_long *)0x752f31,in_stack_ffffffffffffffc8);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"DvpVerifyResize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceMemoryBase.hpp"
               ,0x54);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void DvpVerifyResize(Uint64 NewSize) const
    {
        DEV_CHECK_ERR((NewSize % this->m_Desc.PageSize) == 0,
                      "NewSize (", NewSize, ") must be  a multiple of the page size (", this->m_Desc.PageSize, ")");
    }